

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O0

void cali_set_global_double_byname(char *name,double val)

{
  cali_variant_t local_98;
  Variant local_88 [2];
  allocator<char> local_61;
  string local_60;
  Attribute local_40;
  Attribute attr;
  Caliper c;
  double val_local;
  char *name_local;
  
  cali::Caliper::Caliper((Caliper *)&attr);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,name,&local_61);
  local_40 = cali::Caliper::create_attribute
                       ((Caliper *)&attr,&local_60,CALI_TYPE_DOUBLE,0x640,0,(Attribute *)0x0,
                        (Variant *)0x0);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  local_98 = cali_make_variant_from_double(val);
  cali::Variant::Variant(local_88,&local_98);
  cali::Caliper::set((Caliper *)&attr,&local_40,local_88);
  cali::Caliper::~Caliper((Caliper *)&attr);
  return;
}

Assistant:

void cali_set_global_double_byname(const char* name, double val)
{
    Caliper   c;
    Attribute attr =
        c.create_attribute(name, CALI_TYPE_DOUBLE, CALI_ATTR_GLOBAL | CALI_ATTR_UNALIGNED | CALI_ATTR_SKIP_EVENTS);

    // TODO: check for existing incompatible attribute key

    c.set(attr, cali_make_variant_from_double(val));
}